

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

int Pdr_ManCubeJust(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  uint uVar1;
  Pdr_Set_t *pPVar2;
  Aig_Man_t *pAig;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int Heur;
  long lVar6;
  
  Heur = 0;
  do {
    if (Heur == 4) {
      return 0;
    }
    pPVar2 = p->pCubeJust;
    pPVar2->nLits = 0;
    pPVar2->Sign = 0;
    Aig_ManIncrementTravId(p->pAig);
    for (lVar6 = 0; iVar5 = pCube->nLits, lVar6 < iVar5; lVar6 = lVar6 + 1) {
      uVar1 = *(uint *)(&pCube->field_0x14 + lVar6 * 4);
      if (uVar1 != 0xffffffff) {
        pAig = p->pAig;
        uVar4 = ((int)uVar1 >> 1) + pAig->nTruePos;
        if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar3 = *(ulong *)((long)pAig->vCos->pArray[uVar4] + 8);
        iVar5 = Pdr_NtkFindSatAssign_rec
                          (pAig,(Aig_Obj_t *)(uVar3 & 0xfffffffffffffffe),~(uVar1 ^ (uint)uVar3) & 1
                           ,p->pCubeJust,Heur);
        if (iVar5 == 0) {
          iVar5 = pCube->nLits;
          break;
        }
      }
    }
    if (iVar5 <= (int)lVar6) {
      iVar5 = p->pCubeJust->nLits;
      if (iVar5 != 0) {
        Vec_IntSelectSort((int *)&p->pCubeJust->field_0x14,iVar5);
        iVar5 = Pdr_SetContainsSimple(p->pCubeJust,pCube);
        if ((iVar5 == 0) && (iVar5 = Pdr_ManCheckContainment(p,k,p->pCubeJust), iVar5 == 0)) {
          return 1;
        }
      }
    }
    Heur = Heur + 1;
  } while( true );
}

Assistant:

int Pdr_ManCubeJust( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Aig_Obj_t * pNode;
    int i, v, fCompl;
//    return 0;
    for ( i = 0; i < 4; i++ )
    {
        // derive new assignment
        p->pCubeJust->nLits = 0;
        p->pCubeJust->Sign  = 0;
        Aig_ManIncrementTravId( p->pAig );
        for ( v = 0; v < pCube->nLits; v++ )
        {
            if ( pCube->Lits[v] == -1 )
                continue;
            pNode  = Saig_ManLi( p->pAig, lit_var(pCube->Lits[v]) );
            fCompl = lit_sign(pCube->Lits[v]) ^ Aig_ObjFaninC0(pNode);
            if ( !Pdr_NtkFindSatAssign_rec( p->pAig, Aig_ObjFanin0(pNode), !fCompl, p->pCubeJust, i ) )
                break;
        }
        if ( v < pCube->nLits )
            continue;
        // figure this out!!!
        if ( p->pCubeJust->nLits == 0 )
            continue;
        // successfully derived new assignment
        Vec_IntSelectSort( p->pCubeJust->Lits, p->pCubeJust->nLits );
        // check assignment against this cube
        if ( Pdr_SetContainsSimple( p->pCubeJust, pCube ) )
            continue;
//printf( "\n" );
//Pdr_SetPrint( stdout, pCube,        Saig_ManRegNum(p->pAig), NULL ); printf( "\n" );
//Pdr_SetPrint( stdout, p->pCubeJust, Saig_ManRegNum(p->pAig), NULL ); printf( "\n" );
        // check assignment against the clauses
        if ( Pdr_ManCheckContainment( p, k, p->pCubeJust ) )
            continue;
        // find good assignment
        return 1;
    }
    return 0;
}